

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

int run_test_fork_signal_to_child(void)

{
  int iVar1;
  undefined8 uVar2;
  ssize_t sVar3;
  uv_loop_t *loop;
  undefined1 local_ad;
  int local_ac;
  int iStack_a8;
  char sync_buf [1];
  int sync_pipe [2];
  pid_t child_pid;
  uv_signal_t signal_handle;
  
  fork_signal_cb_called = 0;
  iVar1 = pipe(&local_ac);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xef,"0 == pipe(sync_pipe)");
    abort();
  }
  run_timer_loop_once();
  uVar2 = uv_default_loop();
  iVar1 = uv_signal_init(uVar2,sync_pipe + 1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xf4,"0 == uv_signal_init(uv_default_loop(), &signal_handle)");
    abort();
  }
  iVar1 = uv_signal_start(sync_pipe + 1,fork_signal_to_child_cb,10);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xf5,"0 == uv_signal_start(&signal_handle, fork_signal_to_child_cb, SIGUSR1)");
    abort();
  }
  sync_pipe[0] = fork();
  if (sync_pipe[0] == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xf8,"child_pid != -1");
    abort();
  }
  if (sync_pipe[0] == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0x107,"0 == uv_loop_fork(uv_default_loop())");
      abort();
    }
    sVar3 = write(iStack_a8,"1",1);
    if (sVar3 != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0x108,"1 == write(sync_pipe[1], \"1\", 1)");
      abort();
    }
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0x10a,"0 != uv_loop_alive(uv_default_loop())");
      abort();
    }
    printf("Running loop in child\n");
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0x10c,"0 == uv_run(uv_default_loop(), UV_RUN_ONCE)");
      abort();
    }
    if (fork_signal_cb_called != 10) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0x10d,"SIGUSR1 == fork_signal_cb_called");
      abort();
    }
  }
  else {
    sVar3 = read(local_ac,&local_ad,1);
    if (sVar3 != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xfc,"1 == read(sync_pipe[0], sync_buf, 1)");
      abort();
    }
    iVar1 = kill(sync_pipe[0],10);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xfd,"0 == kill(child_pid, SIGUSR1)");
      abort();
    }
    printf("Running loop in parent\n");
    uv_unref(sync_pipe + 1);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0x101,"0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT)");
      abort();
    }
    if (fork_signal_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0x102,"0 == fork_signal_cb_called");
      abort();
    }
    printf("Waiting for child in parent\n");
    assert_wait_child(sync_pipe[0]);
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 == 0) {
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,0x110,"0 == uv_loop_close(uv_default_loop())");
  abort();
}

Assistant:

TEST_IMPL(fork_signal_to_child) {
  /* A signal handler installed before forking
     is run only in the child when the child is signalled. */
  uv_signal_t signal_handle;
  pid_t child_pid;
  int sync_pipe[2];
  char sync_buf[1];

  fork_signal_cb_called = 0;    /* reset */

  ASSERT(0 == pipe(sync_pipe));

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == uv_signal_init(uv_default_loop(), &signal_handle));
  ASSERT(0 == uv_signal_start(&signal_handle, fork_signal_to_child_cb, SIGUSR1));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(1 == read(sync_pipe[0], sync_buf, 1)); /* wait for child */
    ASSERT(0 == kill(child_pid, SIGUSR1));
    /* Run the loop, make sure we don't get the signal. */
    printf("Running loop in parent\n");
    uv_unref((uv_handle_t*)&signal_handle);
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));
    ASSERT(0 == fork_signal_cb_called);
    printf("Waiting for child in parent\n");
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(1 == write(sync_pipe[1], "1", 1)); /* alert parent */
    /* Get the signal. */
    ASSERT(0 != uv_loop_alive(uv_default_loop()));
    printf("Running loop in child\n");
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
    ASSERT(SIGUSR1 == fork_signal_cb_called);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}